

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall c4::yml::Parser::_slurp_doc_scalar(Parser *this)

{
  char cVar1;
  State *pSVar2;
  pfn_error p_Var3;
  code *pcVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  csubstr s;
  csubstr s_00;
  csubstr s_01;
  bool bVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  byte bVar14;
  csubstr cVar15;
  csubstr cVar16;
  ro_substr pattern;
  ro_substr chars;
  ro_substr chars_00;
  basic_substring<const_char> local_f8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  csubstr cStack_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  csubstr cStack_a0;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  csubstr cStack_78;
  char msg [73];
  
  bVar14 = 0;
  pSVar2 = this->m_state;
  local_f8.str = (pSVar2->line_contents).rem.str;
  local_f8.len = (pSVar2->line_contents).rem.len;
  sVar10 = (pSVar2->pos).super_LineCol.offset;
  pattern.len = 3;
  pattern.str = "---";
  sVar9 = basic_substring<const_char>::find(&(pSVar2->line_contents).full,pattern,0);
  if (sVar9 == 0xffffffffffffffff) {
    pcVar12 = "check failed: (m_state->line_contents.full.find(\"---\") != csubstr::npos)";
    pcVar13 = msg;
    for (lVar11 = 0x49; lVar11 != 0; lVar11 = lVar11 + -1) {
      *pcVar13 = *pcVar12;
      pcVar12 = pcVar12 + (ulong)bVar14 * -2 + 1;
      pcVar13 = pcVar13 + (ulong)bVar14 * -2 + 1;
    }
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar4 = (code *)swi(3);
      cVar15 = (csubstr)(*pcVar4)();
      return cVar15;
    }
    p_Var3 = (this->m_stack).m_callbacks.m_error;
    local_90 = 0;
    uStack_88 = 0x72d4;
    local_80 = 0;
    cStack_78 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
    LVar5.super_LineCol.line = uStack_88;
    LVar5.super_LineCol.offset = local_90;
    LVar5.super_LineCol.col = local_80;
    LVar5.name.str = cStack_78.str;
    LVar5.name.len = cStack_78.len;
    (*p_Var3)(msg,0x49,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  if (local_f8.len == 0) {
    _line_ended(this);
    _scan_line(this);
    pSVar2 = this->m_state;
    local_f8.str = (pSVar2->line_contents).rem.str;
    local_f8.len = (pSVar2->line_contents).rem.len;
    sVar10 = (pSVar2->pos).super_LineCol.offset;
  }
  chars.len = 2;
  chars.str = " \t";
  sVar9 = basic_substring<const_char>::first_not_of(&local_f8,chars,0);
  if (sVar9 != 0xffffffffffffffff) {
    _line_progressed(this,sVar9);
    pSVar2 = this->m_state;
    local_f8.str = (pSVar2->line_contents).rem.str;
    local_f8.len = (pSVar2->line_contents).rem.len;
    sVar10 = (pSVar2->pos).super_LineCol.offset;
  }
  if (((this->m_val_anchor).len != 0) && ((this->m_val_anchor).str != (char *)0x0)) {
    builtin_strncpy(msg,"check failed: (m_val_anchor.empty())",0x25);
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar4 = (code *)swi(3);
      cVar15 = (csubstr)(*pcVar4)();
      return cVar15;
    }
    p_Var3 = (this->m_stack).m_callbacks.m_error;
    local_b8 = 0;
    uStack_b0 = 0x72e8;
    local_a8 = 0;
    cStack_a0 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
    LVar6.super_LineCol.line = uStack_b0;
    LVar6.super_LineCol.offset = local_b8;
    LVar6.super_LineCol.col = local_a8;
    LVar6.name.str = cStack_a0.str;
    LVar6.name.len = cStack_a0.len;
    (*p_Var3)(msg,0x25,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  _handle_val_anchors_and_refs(this);
  if (((this->m_val_anchor).len != 0) && ((this->m_val_anchor).str != (char *)0x0)) {
    local_f8.str = (this->m_state->line_contents).rem.str;
    local_f8.len = (this->m_state->line_contents).rem.len;
    chars_00.len = 2;
    chars_00.str = " \t";
    sVar10 = basic_substring<const_char>::first_not_of(&local_f8,chars_00,0);
    if (sVar10 != 0xffffffffffffffff) {
      _line_progressed(this,sVar10);
    }
    pSVar2 = this->m_state;
    local_f8.str = (pSVar2->line_contents).rem.str;
    local_f8.len = (pSVar2->line_contents).rem.len;
    sVar10 = (pSVar2->pos).super_LineCol.offset;
  }
  s_00.len = local_f8.len;
  s_00.str = local_f8.str;
  s.len = local_f8.len;
  s.str = local_f8.str;
  cVar15.len = local_f8.len;
  cVar15.str = local_f8.str;
  if (local_f8.len != 0) {
    cVar1 = *local_f8.str;
    if (cVar1 == '\"') {
      sVar10 = LineContents::current_col(&this->m_state->line_contents,s_00);
      this->m_state->scalar_col = sVar10;
      cVar15 = _scan_dquot_scalar(this);
      return cVar15;
    }
    if ((cVar1 == '|') || (cVar1 == '>')) {
      cVar15 = _scan_block(this);
      return cVar15;
    }
    if (cVar1 == '\'') {
      sVar10 = LineContents::current_col(&this->m_state->line_contents,cVar15);
      this->m_state->scalar_col = sVar10;
      cVar15 = _scan_squot_scalar(this);
      return cVar15;
    }
  }
  sVar9 = LineContents::current_col(&this->m_state->line_contents,s);
  this->m_state->scalar_col = sVar9;
  pcVar12 = (this->m_buf).str;
  if (local_f8.str + local_f8.len < pcVar12 + sVar10) {
    builtin_strncpy(msg + 0x10,".end() >= m_buf.begin() + pos)",0x1f);
    builtin_strncpy(msg,"check failed: (s",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar4 = (code *)swi(3);
      cVar15 = (csubstr)(*pcVar4)();
      return cVar15;
    }
    p_Var3 = (this->m_stack).m_callbacks.m_error;
    local_e0 = 0;
    uStack_d8 = 0x7309;
    local_d0 = 0;
    cStack_c8 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
    LVar7.super_LineCol.line = uStack_d8;
    LVar7.super_LineCol.offset = local_e0;
    LVar7.super_LineCol.col = local_d0;
    LVar7.name.str = cStack_c8.str;
    LVar7.name.len = cStack_c8.len;
    (*p_Var3)(msg,0x2f,LVar7,(this->m_stack).m_callbacks.m_user_data);
    pcVar12 = (this->m_buf).str;
  }
  _line_progressed(this,(size_t)(local_f8.str + (local_f8.len - (long)(pcVar12 + sVar10))));
  bVar8 = _at_line_end(this);
  s_01.len = local_f8.len;
  s_01.str = local_f8.str;
  cVar16.len = local_f8.len;
  cVar16.str = local_f8.str;
  if (bVar8) {
    cVar16 = _extend_scanned_scalar(this,s_01);
  }
  return cVar16;
}

Assistant:

csubstr Parser::_slurp_doc_scalar()
{
    csubstr s = m_state->line_contents.rem;
    size_t pos = m_state->pos.offset;
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.full.find("---") != csubstr::npos);
    _c4dbgpf("slurp 0 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    if(s.len == 0)
    {
        _line_ended();
        _scan_line();
        s = m_state->line_contents.rem;
        pos = m_state->pos.offset;
    }

    size_t skipws = s.first_not_of(" \t");
    _c4dbgpf("slurp 1 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    if(skipws != npos)
    {
        _line_progressed(skipws);
        s = m_state->line_contents.rem;
        pos = m_state->pos.offset;
        _c4dbgpf("slurp 2 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, m_val_anchor.empty());
    _handle_val_anchors_and_refs();
    if(!m_val_anchor.empty())
    {
        s = m_state->line_contents.rem;
        skipws = s.first_not_of(" \t");
        if(skipws != npos)
        {
            _line_progressed(skipws);
        }
        s = m_state->line_contents.rem;
        pos = m_state->pos.offset;
        _c4dbgpf("slurp 3 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    }

    if(s.begins_with('\''))
    {
        m_state->scalar_col = m_state->line_contents.current_col(s);
        return _scan_squot_scalar();
    }
    else if(s.begins_with('"'))
    {
        m_state->scalar_col = m_state->line_contents.current_col(s);
        return _scan_dquot_scalar();
    }
    else if(s.begins_with('|') || s.begins_with('>'))
    {
        return _scan_block();
    }

    _c4dbgpf("slurp 4 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));

    m_state->scalar_col = m_state->line_contents.current_col(s);
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() >= m_buf.begin() + pos);
    _line_progressed(static_cast<size_t>(s.end() - (m_buf.begin() + pos)));

    _c4dbgpf("slurp 5 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));

    if(_at_line_end())
    {
        _c4dbgpf("at line end. curr='{}'", s);
        s = _extend_scanned_scalar(s);
    }

    _c4dbgpf("scalar was '{}'", s);

    return s;
}